

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

void free_temp_abbrevs(Dwarf_D_Abbrev_s *firstab)

{
  Dwarf_D_Abbrev_s *pDVar1;
  Dwarf_D_Abbrev_s *nxtab;
  Dwarf_D_Abbrev_s *curab;
  Dwarf_D_Abbrev_s *firstab_local;
  
  nxtab = firstab;
  while (nxtab != (Dwarf_D_Abbrev_s *)0x0) {
    pDVar1 = nxtab->da_next;
    nxtab->da_next = (Dwarf_D_Abbrev_s *)0x0;
    free(nxtab);
    nxtab = pDVar1;
  }
  return;
}

Assistant:

static void
free_temp_abbrevs( struct Dwarf_D_Abbrev_s * firstab)
{
    struct Dwarf_D_Abbrev_s *curab = firstab;

    while (curab) {
        struct Dwarf_D_Abbrev_s *nxtab = 0;

        nxtab = curab->da_next;
        curab->da_next = 0;
        free(curab);
        curab = nxtab;
    }
}